

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

bool __thiscall toml::internal::Parser::parseValue(Parser *this,Value *v)

{
  bool v_00;
  TokenType TVar1;
  Token *pTVar2;
  int64_t v_01;
  Parser *in_RDI;
  double v_02;
  Value *in_stack_00000030;
  Parser *in_stack_00000038;
  string *in_stack_00000118;
  Parser *in_stack_00000120;
  Time *in_stack_ffffffffffffff38;
  Value *in_stack_ffffffffffffff40;
  allocator *paVar3;
  string *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [16];
  Parser *in_stack_ffffffffffffff80;
  Value local_58;
  Value local_48;
  anon_union_8_8_51f126cb_for_Value_2 in_stack_ffffffffffffffd0;
  Parser *in_stack_ffffffffffffffd8;
  bool local_1;
  
  pTVar2 = token(in_RDI);
  TVar1 = Token::type(pTVar2);
  switch(TVar1) {
  case ERROR_TOKEN:
    pTVar2 = token(in_RDI);
    Token::strValue_abi_cxx11_(pTVar2);
    addError(in_stack_00000120,in_stack_00000118);
    local_1 = false;
    break;
  default:
    paVar3 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"unexpected token",paVar3);
    addError(in_stack_00000120,in_stack_00000118);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_1 = false;
    break;
  case STRING:
  case MULTILINE_STRING:
    pTVar2 = token(in_RDI);
    Token::strValue_abi_cxx11_(pTVar2);
    Value::Value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Value::operator=((Value *)in_RDI,in_stack_ffffffffffffff40);
    Value::~Value(in_stack_ffffffffffffff60);
    nextValue(in_stack_ffffffffffffff80);
    local_1 = true;
    break;
  case BOOL:
    pTVar2 = token(in_RDI);
    v_00 = Token::boolValue(pTVar2);
    Value::Value((Value *)&stack0xffffffffffffffc8,v_00);
    Value::operator=((Value *)in_RDI,in_stack_ffffffffffffff40);
    Value::~Value(in_stack_ffffffffffffff60);
    nextValue(in_stack_ffffffffffffff80);
    local_1 = true;
    break;
  case INT:
    pTVar2 = token(in_RDI);
    v_01 = Token::intValue(pTVar2);
    Value::Value(&local_48,v_01);
    Value::operator=((Value *)in_RDI,in_stack_ffffffffffffff40);
    Value::~Value(in_stack_ffffffffffffff60);
    nextValue(in_stack_ffffffffffffff80);
    local_1 = true;
    break;
  case DOUBLE:
    pTVar2 = token(in_RDI);
    v_02 = Token::doubleValue(pTVar2);
    Value::Value(&local_58,v_02);
    Value::operator=((Value *)in_RDI,in_stack_ffffffffffffff40);
    Value::~Value(in_stack_ffffffffffffff60);
    nextValue(in_stack_ffffffffffffff80);
    local_1 = true;
    break;
  case TIME:
    pTVar2 = token(in_RDI);
    Token::timeValue(pTVar2);
    Value::Value(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Value::operator=((Value *)in_RDI,in_stack_ffffffffffffff40);
    Value::~Value(in_stack_ffffffffffffff60);
    nextValue(in_stack_ffffffffffffff80);
    local_1 = true;
    break;
  case LBRACKET:
    local_1 = parseArray(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    break;
  case LBRACE:
    local_1 = parseInlineTable(in_stack_00000038,in_stack_00000030);
  }
  return local_1;
}

Assistant:

inline bool Parser::parseValue(Value* v)
{
    switch (token().type()) {
    case TokenType::STRING:
    case TokenType::MULTILINE_STRING:
        *v = token().strValue();
        nextValue();
        return true;
    case TokenType::LBRACKET:
        return parseArray(v);
    case TokenType::LBRACE:
        return parseInlineTable(v);
    case TokenType::BOOL:
        *v = token().boolValue();
        nextValue();
        return true;
    case TokenType::INT:
        *v = token().intValue();
        nextValue();
        return true;
    case TokenType::DOUBLE:
        *v = token().doubleValue();
        nextValue();
        return true;
    case TokenType::TIME:
        *v = token().timeValue();
        nextValue();
        return true;
    case TokenType::ERROR_TOKEN:
        addError(token().strValue());
        return false;
    default:
        addError("unexpected token");
        return false;
    }
}